

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eventAgentTest.cpp
# Opt level: O0

void __thiscall TestClass::AsyncFunc2(TestClass *this,uint32_t p1,int16_t p2)

{
  AsyncEventAgent2<TestClass,_unsigned_int,_short> *this_00;
  size_t __n;
  void *__buf;
  AsyncEventAgent2<TestClass,_unsigned_int,_short> *agent;
  int16_t p2_local;
  uint32_t p1_local;
  TestClass *this_local;
  
  this_00 = (AsyncEventAgent2<TestClass,_unsigned_int,_short> *)
            operator_new(0x38,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/test/eventAgentTest.cpp"
                         ,0x3d);
  __n = 0;
  AsyncEventAgent2<TestClass,_unsigned_int,_short>::AsyncEventAgent2
            (this_00,this,0x10e600,0,(short)p1);
  AsyncEventAgent::send((AsyncEventAgent *)this_00,(int)this + 8,__buf,__n,p1);
  return;
}

Assistant:

void AsyncFunc2(uint32_t p1, int16_t p2)
	{
		AsyncEventAgent2<TestClass, uint32_t, int16_t> *agent =
			jh_new AsyncEventAgent2<TestClass, uint32_t, int16_t>(this, &TestClass::handleAsyncFunc2,
				p1, p2);
		agent->send(&mEventThread);
	}